

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
NominalTest_TestMaxStructDepths_Test::TestBody(NominalTest_TestMaxStructDepths_Test *this)

{
  allocator<wasm::HeapType> *this_00;
  initializer_list<wasm::HeapType> __l;
  bool bVar1;
  char *pcVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar3;
  mapped_type *pmVar4;
  char *in_R9;
  AssertHelper local_2c8;
  Message local_2c0;
  uint local_2b4;
  HeapType local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_4;
  Message local_290;
  uint local_284;
  HeapType local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_3;
  Message local_260;
  uint local_254;
  HeapType local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_2;
  Message local_230;
  uint local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_1;
  Message local_208;
  uint local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  maxDepths;
  HeapType local_1a8;
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> local_1a0;
  iterator local_198;
  size_type local_190;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_188;
  undefined1 local_170 [8];
  SubTypes subTypes;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_100;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Entry local_98;
  Struct local_88 [2];
  Entry local_58;
  Struct local_48;
  TypeBuilder local_28;
  TypeBuilder builder;
  HeapType B;
  HeapType A;
  NominalTest_TestMaxStructDepths_Test *this_local;
  
  wasm::HeapType::HeapType(&B);
  wasm::HeapType::HeapType((HeapType *)&builder);
  wasm::TypeBuilder::TypeBuilder(&local_28,2);
  local_48.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_48);
  local_58 = wasm::TypeBuilder::operator[](&local_28,0);
  wasm::TypeBuilder::Entry::operator=(&local_58,&local_48);
  wasm::Struct::~Struct(&local_48);
  local_88[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(local_88);
  local_98 = wasm::TypeBuilder::operator[](&local_28,1);
  wasm::TypeBuilder::Entry::operator=(&local_98,local_88);
  wasm::Struct::~Struct(local_88);
  wasm::TypeBuilder::getTempHeapType((ulong)&local_28);
  wasm::TypeBuilder::setSubType((ulong)&local_28,(HeapType)0x1);
  wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_d0,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_100,(internal *)local_d0,(AssertionResult *)"result","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x3f1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  if (bVar1) {
    __x = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &subTypes.typeSubTypes._M_h._M_single_bucket,__x);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &subTypes.typeSubTypes._M_h._M_single_bucket,0);
    B.id = pvVar3->id;
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &subTypes.typeSubTypes._M_h._M_single_bucket,1);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         pvVar3->id;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &subTypes.typeSubTypes._M_h._M_single_bucket);
  }
  wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  wasm::TypeBuilder::~TypeBuilder(&local_28);
  if (bVar1) {
    local_1a8.id = B.id;
    local_1a0._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
          )(__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
            )builder.impl._M_t.
             super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    local_198 = &local_1a8;
    local_190 = 2;
    this_00 = (allocator<wasm::HeapType> *)((long)&maxDepths._M_h._M_single_bucket + 7);
    std::allocator<wasm::HeapType>::allocator(this_00);
    __l._M_len = local_190;
    __l._M_array = local_198;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&local_188,__l,this_00);
    wasm::SubTypes::SubTypes((SubTypes *)local_170,&local_188);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_188);
    std::allocator<wasm::HeapType>::~allocator
              ((allocator<wasm::HeapType> *)((long)&maxDepths._M_h._M_single_bucket + 7));
    wasm::SubTypes::getMaxDepths
              ((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                *)&gtest_ar.message_,(SubTypes *)local_170);
    pmVar4 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&gtest_ar.message_,(key_type *)&builder);
    local_1fc = 0;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_1f8,"maxDepths[B]","Index(0)",pmVar4,&local_1fc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
    if (!bVar1) {
      testing::Message::Message(&local_208);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x3fa,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_208);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_208);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
    pmVar4 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&gtest_ar.message_,&B);
    local_224 = 1;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_220,"maxDepths[A]","Index(1)",pmVar4,&local_224);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
    if (!bVar1) {
      testing::Message::Message(&local_230);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x3fb,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_230);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_230);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
    wasm::HeapType::HeapType(&local_250,struct_);
    pmVar4 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&gtest_ar.message_,&local_250);
    local_254 = 2;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_248,"maxDepths[HeapType::struct_]","Index(2)",pmVar4,&local_254);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x3fc,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_260);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_260);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
    wasm::HeapType::HeapType(&local_280,eq);
    pmVar4 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&gtest_ar.message_,&local_280);
    local_284 = 3;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_278,"maxDepths[HeapType::eq]","Index(3)",pmVar4,&local_284);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
    if (!bVar1) {
      testing::Message::Message(&local_290);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x3fd,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_290);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_290);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
    wasm::HeapType::HeapType(&local_2b0,any);
    pmVar4 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&gtest_ar.message_,&local_2b0);
    local_2b4 = 4;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_2a8,"maxDepths[HeapType::any]","Index(4)",pmVar4,&local_2b4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
    if (!bVar1) {
      testing::Message::Message(&local_2c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
      testing::internal::AssertHelper::AssertHelper
                (&local_2c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x3fe,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
      testing::internal::AssertHelper::~AssertHelper(&local_2c8);
      testing::Message::~Message(&local_2c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
    std::
    unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_map((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                      *)&gtest_ar.message_);
    wasm::SubTypes::~SubTypes((SubTypes *)local_170);
  }
  return;
}

Assistant:

TEST_F(NominalTest, TestMaxStructDepths) {
  /*
      A
      |
      B
  */
  HeapType A, B;
  {
    TypeBuilder builder(2);
    builder[0] = Struct();
    builder[1] = Struct();
    builder.setSubType(1, builder.getTempHeapType(0));
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A = built[0];
    B = built[1];
  }

  SubTypes subTypes({A, B});
  auto maxDepths = subTypes.getMaxDepths();

  EXPECT_EQ(maxDepths[B], Index(0));
  EXPECT_EQ(maxDepths[A], Index(1));
  EXPECT_EQ(maxDepths[HeapType::struct_], Index(2));
  EXPECT_EQ(maxDepths[HeapType::eq], Index(3));
  EXPECT_EQ(maxDepths[HeapType::any], Index(4));
}